

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadFunctions.cpp
# Opt level: O1

void __thiscall
Consumer::operator()
          (Consumer *this,Queue<int> *q,int id,
          vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
          *subscribeTime,
          vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
          *unsubscribeTime,TimeT readingCycleTime)

{
  pointer pdVar1;
  iterator __position;
  pointer pdVar2;
  long lVar3;
  int *piVar4;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  *pvVar5;
  int iVar6;
  int *piVar7;
  optional<int> oVar8;
  long lVar9;
  ostream *poVar10;
  pthread_t pVar11;
  ulong uVar12;
  ulong uVar13;
  _Storage<int,_true> _Var14;
  ulong uVar15;
  int *it;
  unique_lock<std::mutex> mlock;
  unique_lock<std::mutex> local_78;
  Queue<int> *local_68;
  int local_5c;
  ulong local_58;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  *local_50;
  ulong local_48;
  mutex_type *local_40;
  long local_38;
  
  local_68 = q;
  local_58 = readingCycleTime.__r;
  local_38 = std::chrono::_V2::system_clock::now();
  std::vector<int,_std::allocator<int>_>::reserve(&this->consumedValues,200);
  pdVar1 = (subscribeTime->
           super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((subscribeTime->
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pdVar1) {
    uVar12 = 0;
    uVar13 = 0;
LAB_00105966:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
               uVar13);
LAB_0010596d:
    std::__throw_bad_optional_access();
  }
  uVar12 = pdVar1->__r;
  if (0 < (long)uVar12) {
    local_78._M_device = (mutex_type *)(uVar12 / 1000);
    local_78._8_8_ = (uVar12 % 1000) * 1000000;
    do {
      iVar6 = nanosleep((timespec *)&local_78,(timespec *)&local_78);
      if (iVar6 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
  }
  local_40 = (mutex_type *)(local_58 / 1000);
  local_48 = (local_58 % 1000) * 1000000;
  uVar12 = 0;
  local_5c = id;
  local_50 = subscribeTime;
  do {
    rtb::Concurrency::Queue<int>::subscribe(local_68);
    do {
      if (0 < (long)local_58) {
        local_78._M_device = local_40;
        local_78._8_8_ = local_48;
        do {
          iVar6 = nanosleep((timespec *)&local_78,(timespec *)&local_78);
          if (iVar6 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
      }
      oVar8 = rtb::Concurrency::Queue<int>::pop(local_68);
      if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) == 0) goto LAB_0010596d;
      _Var14._M_value =
           oVar8.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      local_78._M_device = (mutex_type *)CONCAT44(local_78._M_device._4_4_,_Var14._M_value);
      if (_Var14._M_value != 0x7fffffff) {
        __position._M_current =
             (this->consumedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->consumedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)this,__position,(int *)&local_78);
        }
        else {
          *__position._M_current = (int)_Var14;
          (this->consumedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pdVar1 = (unsubscribeTime->
               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(unsubscribeTime->
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
      if (uVar13 <= uVar12) goto LAB_00105966;
      lVar9 = std::chrono::_V2::system_clock::now();
    } while ((_Var14._M_value != 0x7fffffff) && ((lVar9 - local_38) / 1000000 < pdVar1[uVar12].__r))
    ;
    rtb::Concurrency::Queue<int>::unsubscribe(local_68);
    pvVar5 = local_50;
    uVar15 = (ulong)((int)uVar12 + 1);
    pdVar1 = (local_50->
             super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar15 < (ulong)((long)(local_50->
                               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
      pdVar2 = (unsubscribeTime->
               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(unsubscribeTime->
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
      if (uVar13 <= uVar12) goto LAB_00105966;
      lVar9 = pdVar1[uVar15].__r;
      lVar3 = pdVar2[uVar12].__r;
      uVar12 = lVar9 - lVar3;
      if (uVar12 != 0 && lVar3 <= lVar9) {
        local_78._M_device = (mutex_type *)(uVar12 / 1000);
        local_78._8_8_ = (uVar12 % 1000) * 1000000;
        do {
          iVar6 = nanosleep((timespec *)&local_78,(timespec *)&local_78);
          if (iVar6 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
      }
    }
    if ((_Var14._M_value == 0x7fffffff) ||
       (uVar12 = uVar15,
       (ulong)((long)(pvVar5->
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar5->
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar15)) {
      local_78._M_device = &outputMutex;
      local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock(&local_78);
      local_78._M_owns = true;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Consumer ",9);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
      pVar11 = pthread_self();
      if (pVar11 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"thread::id of a non-executing thread",0x24);
      }
      else {
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,")  popped the following values: \n",0x21);
      piVar4 = (this->consumedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar7 = (this->consumedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar7 != piVar4; piVar7 = piVar7 + 1) {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      std::unique_lock<std::mutex>::unlock(&local_78);
      std::unique_lock<std::mutex>::~unique_lock(&local_78);
      return;
    }
  } while( true );
}

Assistant:

void Consumer::operator()(Queue<int> &q,
    const int id,
    const std::vector<TimeT> &subscribeTime,
    const std::vector<TimeT> &unsubscribeTime,
    TimeT readingCycleTime) {
    bool lastMessage = false;
    unsigned nextConsumerPeriod = 0;

    auto start = std::chrono::system_clock::now();
    consumedValues.reserve(200);
    std::this_thread::sleep_for(subscribeTime.at(nextConsumerPeriod));

    // start time for consumers and producer are not exactly the same
    // but for test purposes is ok

    do {
        q.subscribe();

        bool timeToUnsubscribe = false;

        do {
            std::this_thread::sleep_for(readingCycleTime);
            auto item = q.pop().value();
            lastMessage = (item == std::numeric_limits<int>::max());
            if (!lastMessage) consumedValues.push_back(item);

            timeToUnsubscribe =
                (unsubscribeTime.at(nextConsumerPeriod)
                    <= std::chrono::duration_cast<TimeT>(std::chrono::system_clock::now() - start));

        } while (!lastMessage && !timeToUnsubscribe);
        q.unsubscribe();
        nextConsumerPeriod++;
        if (nextConsumerPeriod < subscribeTime.size()) {
            std::this_thread::sleep_for(
                subscribeTime.at(nextConsumerPeriod) - unsubscribeTime.at(nextConsumerPeriod - 1));
        }
    } while ((!lastMessage) && (nextConsumerPeriod < subscribeTime.size()));

    std::unique_lock<std::mutex> mlock(outputMutex);
    std::cout << "Consumer " << id << " (" << std::this_thread::get_id()
              << ")  popped the following values: \n";
    for (auto &it : consumedValues)
        std::cout << it << " ";
    std::cout << std::endl;
    mlock.unlock();
}